

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-merge.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::
unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::
allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::
equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::
unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::
allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper::mapName(wasm::
ModuleItemKind,wasm::Name__(void *this,ModuleItemKind kind,Name *name)

{
  iterator updates;
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  IString local_58;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true> local_48;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true> local_40;
  iterator iter2;
  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  *nameUpdates;
  _Node_iterator_base<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_false>
  local_28;
  iterator iter;
  Name *name_local;
  void *pvStack_10;
  ModuleItemKind kind_local;
  NameMapper *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_false>
             )(_Node_iterator_base<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_false>
               )name;
  name_local._4_4_ = kind;
  pvStack_10 = this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::ModuleItemKind>,_std::equal_to<wasm::ModuleItemKind>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>
       ::find(*(unordered_map<wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::ModuleItemKind>,_std::equal_to<wasm::ModuleItemKind>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>
                **)((long)this + 0x130),(key_type *)((long)&name_local + 4));
  nameUpdates = (unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                 *)std::
                   unordered_map<wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::ModuleItemKind>,_std::equal_to<wasm::ModuleItemKind>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>
                   ::end(*(unordered_map<wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::ModuleItemKind>,_std::equal_to<wasm::ModuleItemKind>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>
                           **)((long)this + 0x130));
  bVar1 = std::__detail::operator==
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_false>
                      *)&nameUpdates);
  if (!bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_false,_false>
                           *)&local_28);
    iter2.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>._M_cur =
         (_Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>)&ppVar2->second;
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
         ::find((unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                 *)iter2.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>.
                   _M_cur,
                (key_type *)
                iter.
                super__Node_iterator_base<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_false>
                ._M_cur);
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
         ::end(iter2.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>._M_cur
              );
    bVar1 = std::__detail::operator!=(&local_40,&local_48);
    updates = iter2;
    if (bVar1) {
      ppVar3 = std::__detail::_Node_iterator<std::pair<const_wasm::Name,_wasm::Name>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_wasm::Name,_wasm::Name>,_false,_true> *)
                          &local_40);
      local_58.str = (string_view)
                     resolveName(std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std
                     ::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::
                     Name>>>&,wasm::Name,wasm::Name_
                               (this,(NameUpdates *)
                                     updates.
                                     super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>
                                     ._M_cur,(ppVar3->second).super_IString.str,
                                (IString)*(IString *)
                                          iter.
                                          super__Node_iterator_base<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_false>
                                          ._M_cur);
      wasm::Name::operator=
                ((Name *)iter.
                         super__Node_iterator_base<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_false>
                         ._M_cur,(Name *)&local_58);
    }
  }
  return;
}

Assistant:

void mapName(ModuleItemKind kind, Name& name) {
      auto iter = kindNameUpdates.find(kind);
      if (iter == kindNameUpdates.end()) {
        return;
      }
      auto& nameUpdates = iter->second;
      auto iter2 = nameUpdates.find(name);
      if (iter2 != nameUpdates.end()) {
        name = resolveName(nameUpdates, iter2->second, name);
      }
    }